

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_bbdpre.c
# Opt level: O0

int IDABBDPrecSolve(sunrealtype tt,N_Vector yy,N_Vector yp,N_Vector rr,N_Vector rvec,N_Vector zvec,
                   sunrealtype c_j,sunrealtype delta,void *bbd_data)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 in_RCX;
  undefined8 in_R8;
  long in_R9;
  int retval;
  IBBDPrecData pdata;
  
  uVar2 = N_VGetArrayPointer(in_RCX);
  N_VSetArrayPointer(uVar2,*(undefined8 *)(in_R9 + 0x58));
  uVar2 = N_VGetArrayPointer(in_R8);
  N_VSetArrayPointer(uVar2,*(undefined8 *)(in_R9 + 0x50));
  iVar1 = SUNLinSolSolve(0,*(undefined8 *)(in_R9 + 0x48),*(undefined8 *)(in_R9 + 0x40),
                         *(undefined8 *)(in_R9 + 0x50),*(undefined8 *)(in_R9 + 0x58));
  N_VSetArrayPointer(0,*(undefined8 *)(in_R9 + 0x58));
  N_VSetArrayPointer(0,*(undefined8 *)(in_R9 + 0x50));
  return iVar1;
}

Assistant:

static int IDABBDPrecSolve(SUNDIALS_MAYBE_UNUSED sunrealtype tt,
                           SUNDIALS_MAYBE_UNUSED N_Vector yy,
                           SUNDIALS_MAYBE_UNUSED N_Vector yp,
                           SUNDIALS_MAYBE_UNUSED N_Vector rr, N_Vector rvec,
                           N_Vector zvec, SUNDIALS_MAYBE_UNUSED sunrealtype c_j,
                           SUNDIALS_MAYBE_UNUSED sunrealtype delta,
                           void* bbd_data)
{
  IBBDPrecData pdata;
  int retval;

  pdata = (IBBDPrecData)bbd_data;

  /* Attach local data arrays for rvec and zvec to rlocal and zlocal */
  N_VSetArrayPointer(N_VGetArrayPointer(rvec), pdata->rlocal);
  N_VSetArrayPointer(N_VGetArrayPointer(zvec), pdata->zlocal);

  /* Call banded solver object to do the work */
  retval = SUNLinSolSolve(pdata->LS, pdata->PP, pdata->zlocal, pdata->rlocal,
                          ZERO);

  /* Detach local data arrays from rlocal and zlocal */
  N_VSetArrayPointer(NULL, pdata->rlocal);
  N_VSetArrayPointer(NULL, pdata->zlocal);

  return (retval);
}